

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_checkstack(lua_State *L,int size)

{
  StkId pTVar1;
  int iVar2;
  
  iVar2 = 0;
  if (size < 0x1f41) {
    pTVar1 = L->top;
    iVar2 = 0;
    if ((((long)pTVar1 - (long)L->base >> 4) + (long)size < 0x1f41) && (iVar2 = 1, 0 < size)) {
      if ((long)L->stack_last - (long)pTVar1 <= (long)(ulong)(uint)(size << 4)) {
        luaD_growstack(L,size);
        pTVar1 = L->top;
      }
      if (L->ci->top < pTVar1 + size) {
        L->ci->top = pTVar1 + size;
      }
    }
  }
  return iVar2;
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int size) {
  int res = 1;
  lua_lock(L);
  if (size > LUAI_MAXCSTACK || (L->top - L->base + size) > LUAI_MAXCSTACK)
    res = 0;  /* stack overflow */
  else if (size > 0) {
    luaD_checkstack(L, size);
    if (L->ci->top < L->top + size)
      L->ci->top = L->top + size;
  }
  lua_unlock(L);
  return res;
}